

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Gla2Fla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  char *pcVar5;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"vh"), iVar3 == 0x76) {
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (iVar3 != -1) {
    Abc_Print(-2,"usage: &gla_fla [-vh]\n");
    Abc_Print(-2,"\t          maps gate-level into flop-level abstraction\n");
    pcVar5 = "yes";
    if (!bVar2) {
      pcVar5 = "no";
    }
    Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar5);
    Abc_Print(-2,"\t-h      : print the command usage\n");
    return 1;
  }
  pGVar1 = pAbc->pGia;
  if (pGVar1 == (Gia_Man_t *)0x0) {
    pcVar5 = "Abc_CommandAbc9Gla2Fla(): There is no AIG.\n";
  }
  else {
    if (pGVar1->vGateClasses != (Vec_Int_t *)0x0) {
      pVVar4 = pGVar1->vFlopClasses;
      if (pVVar4 != (Vec_Int_t *)0x0) {
        if (pVVar4->pArray != (int *)0x0) {
          free(pVVar4->pArray);
          pGVar1->vFlopClasses->pArray = (int *)0x0;
          pVVar4 = pGVar1->vFlopClasses;
          if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_002937ca;
        }
        free(pVVar4);
        pGVar1->vFlopClasses = (Vec_Int_t *)0x0;
      }
LAB_002937ca:
      pVVar4 = Gia_GlaConvertToFla(pAbc->pGia,pAbc->pGia->vGateClasses);
      pGVar1 = pAbc->pGia;
      pGVar1->vFlopClasses = pVVar4;
      pVVar4 = pGVar1->vGateClasses;
      if (pVVar4 == (Vec_Int_t *)0x0) {
        return 0;
      }
      if (pVVar4->pArray != (int *)0x0) {
        free(pVVar4->pArray);
        pGVar1->vGateClasses->pArray = (int *)0x0;
        pVVar4 = pGVar1->vGateClasses;
        if (pVVar4 == (Vec_Int_t *)0x0) {
          return 0;
        }
      }
      free(pVVar4);
      pGVar1->vGateClasses = (Vec_Int_t *)0x0;
      return 0;
    }
    pcVar5 = "Abc_CommandAbc9Gla2Fla(): There is no gate-level abstraction is defined.\n";
  }
  Abc_Print(-1,pcVar5);
  return 0;
}

Assistant:

int Abc_CommandAbc9Gla2Fla( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Gla2Fla(): There is no AIG.\n" );
        return 0;
    }
    if ( pAbc->pGia->vGateClasses == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Gla2Fla(): There is no gate-level abstraction is defined.\n" );
        return 0;
    }
    Vec_IntFreeP( &pAbc->pGia->vFlopClasses );
    pAbc->pGia->vFlopClasses = Gia_GlaConvertToFla( pAbc->pGia, pAbc->pGia->vGateClasses );
    Vec_IntFreeP( &pAbc->pGia->vGateClasses );
    return 0;

usage:
    Abc_Print( -2, "usage: &gla_fla [-vh]\n" );
    Abc_Print( -2, "\t          maps gate-level into flop-level abstraction\n" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}